

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_record.cpp
# Opt level: O1

void __thiscall cubeb_record_Test::TestBody(cubeb_record_Test *this)

{
  cubeb *context;
  bool bVar1;
  int iVar2;
  stringstream *psVar3;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  char *pcVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertionResult gtest_ar_1;
  user_state_record stream_state;
  int r;
  cubeb_stream *stream;
  cubeb *ctx;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  
  iVar2 = cubeb_set_log_callback(CUBEB_LOG_DISABLED,(cubeb_log_callback)0x0);
  if (iVar2 != 0) {
    TestBody();
  }
  stream_state.invalid_audio_value.super___atomic_base<int>._M_i =
       (atomic<int>)(__atomic_base<int>)0x0;
  r = common_init(&ctx,"Cubeb record example");
  gtest_ar_1._0_8_ = (ulong)(uint)gtest_ar_1._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_1,in_RCX);
  if (gtest_ar.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    gtest_ar_1._0_8_ = psVar3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(psVar3 + 0x10),"Error initializing cubeb library",0x20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stream,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stream,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stream);
    if (gtest_ar_1._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    context = ctx;
    iVar2 = has_available_input_device(ctx);
    if (iVar2 != 0) {
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0xbb80000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      actual = (anon_enum_32 *)0x0;
      r = cubeb_stream_init(ctx,&stream,"Cubeb record (mono)",(cubeb_devid)0x0,
                            (cubeb_stream_params *)&gtest_ar,(cubeb_devid)0x0,
                            (cubeb_stream_params *)0x0,0x1000,data_cb_record,state_cb_record,
                            &stream_state);
      local_78.ptr_ = local_78.ptr_ & 0xffffffff00000000;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_1.success_,(char *)&r,(int *)&local_78,actual);
      if (gtest_ar_1.success_ == false) {
        psVar3 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar3);
        *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(psVar3 + 0x10),"Error initializing cubeb stream",0x1f);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_record.cpp"
                   ,0x65,pcVar4);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
          local_78.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_1.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        TestBody();
      }
    }
    if (context != (cubeb *)0x0) {
      cubeb_destroy(context);
    }
  }
  return;
}

Assistant:

TEST(cubeb, record)
{
  if (cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr /*print_log*/) != CUBEB_OK) {
    fprintf(stderr, "Set log callback failed\n");
  }
  cubeb *ctx;
  cubeb_stream *stream;
  cubeb_stream_params params;
  int r;
  user_state_record stream_state;

  r = common_init(&ctx, "Cubeb record example");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  /* This test needs an available input device, skip it if this host does not
   * have one. */
  if (!has_available_input_device(ctx)) {
    return;
  }

  params.format = STREAM_FORMAT;
  params.rate = SAMPLE_FREQUENCY;
  params.channels = 1;
  params.layout = CUBEB_LAYOUT_UNDEFINED;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb record (mono)", NULL, &params, NULL, nullptr,
                        4096, data_cb_record, state_cb_record, &stream_state);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_stream_start(stream);
  delay(500);
  cubeb_stream_stop(stream);

#ifdef __linux__
  // user callback does not arrive in Linux, silence the error
  fprintf(stderr, "Check is disabled in Linux\n");
#else
  ASSERT_FALSE(stream_state.invalid_audio_value.load());
#endif
}